

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees_emit.h
# Opt level: O0

void zng_tr_emit_tree(deflate_state *s,int type,int last)

{
  uint uVar1;
  uint uVar2;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  uint32_t total_bits;
  uint32_t len;
  uint64_t val;
  uint32_t header_bits;
  uint64_t bi_buf;
  uint32_t bi_valid;
  undefined8 local_20;
  undefined4 local_14;
  
  uVar1 = *(uint *)(in_RDI + 0x1780);
  local_20 = (deflate_state *)(ulong)(uint)(in_ESI * 2 + in_EDX);
  local_14 = 3;
  uVar2 = uVar1 + 3;
  if ((uVar2 < 0x40) && (uVar1 < 0x40)) {
    local_20 = (deflate_state *)
               ((long)local_20 << ((byte)uVar1 & 0x3f) | *(ulong *)(in_RDI + 0x1778));
    local_14 = uVar2;
  }
  else if (uVar1 < 0x40) {
    put_uint64(local_20,CONCAT44(3,uVar2));
    local_20 = (deflate_state *)((ulong)local_20 >> (0x40 - (byte)uVar1 & 0x3f));
    local_14 = uVar2 - 0x40;
  }
  else {
    put_uint64(local_20,CONCAT44(3,uVar2));
  }
  *(uint *)(in_RDI + 0x1780) = local_14;
  *(deflate_state **)(in_RDI + 0x1778) = local_20;
  return;
}

Assistant:

static inline void zng_tr_emit_tree(deflate_state *s, int type, const int last) {
    uint32_t bi_valid = s->bi_valid;
    uint64_t bi_buf = s->bi_buf;
    uint32_t header_bits = (type << 1) + last;
    send_bits(s, header_bits, 3, bi_buf, bi_valid);
    cmpr_bits_add(s, 3);
    s->bi_valid = bi_valid;
    s->bi_buf = bi_buf;
    Tracev((stderr, "\n--- Emit Tree: Last: %u\n", last));
}